

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

QRect __thiscall
QTreeViewPrivate::visualRect(QTreeViewPrivate *this,QModelIndex *index,RectRule rule)

{
  long lVar1;
  QRect QVar2;
  bool bVar3;
  int iVar4;
  int item;
  int iVar5;
  QTreeView *pQVar6;
  ulong uVar7;
  const_reference pQVar8;
  int in_EDX;
  QModelIndex *in_RSI;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int height;
  int y;
  int indentation;
  bool addIndentation;
  int width;
  int x;
  int column;
  bool spanning;
  int viewIndex;
  QTreeView *q;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar9;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int item_00;
  int iVar10;
  QTreeViewPrivate *this_00;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar6 = q_func(in_RDI);
  bVar3 = QAbstractItemViewPrivate::isIndexValid
                    ((QAbstractItemViewPrivate *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (QModelIndex *)
                     CONCAT17(in_stack_ffffffffffffff8f,
                              CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
  if (bVar3) {
    uVar7 = (**(code **)(*(long *)&(pQVar6->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget + 0x2c0))(pQVar6,in_RSI);
    if (((uVar7 & 1) == 0) || (in_EDX == 0)) {
      QAbstractItemViewPrivate::executePostedLayout
                ((QAbstractItemViewPrivate *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      iVar4 = QTreeViewPrivate::viewIndex(this_00,in_RSI);
      if (iVar4 < 0) {
        QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      }
      else {
        pQVar8 = QList<QTreeViewItem>::at
                           ((QList<QTreeViewItem> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        uVar7 = *(ulong *)&pQVar8->field_0x1c;
        iVar4 = QModelIndex::column(in_RSI);
        if ((uVar7 >> 1 & 1) == 0) {
          item_00 = QTreeView::columnViewportPosition
                              ((QTreeView *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               in_stack_ffffffffffffff7c);
          iVar10 = item_00;
          item = QTreeView::columnWidth
                           ((QTreeView *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff7c);
        }
        else {
          item_00 = 0;
          iVar10 = item_00;
          item = QHeaderView::length((QHeaderView *)
                                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        }
        bVar3 = isTreePosition((QTreeViewPrivate *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               in_stack_ffffffffffffff7c);
        if (bVar3) {
          in_stack_ffffffffffffff8e = 0 < iVar4 || in_EDX == 1;
        }
        uVar9 = bVar3 && (0 < iVar4 || in_EDX == 1);
        if (in_EDX == 0) {
          iVar10 = 0;
          QAbstractScrollArea::viewport
                    ((QAbstractScrollArea *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
          item = QWidget::width((QWidget *)0x8f33d7);
        }
        else if ((bool)uVar9) {
          iVar5 = indentationForItem((QTreeViewPrivate *)
                                     CONCAT17(uVar9,CONCAT16(in_stack_ffffffffffffff8e,
                                                             in_stack_ffffffffffffff88)),
                                     in_stack_ffffffffffffff84);
          item = item - iVar5;
          bVar3 = QWidget::isRightToLeft((QWidget *)0x8f340e);
          if (!bVar3) {
            iVar10 = iVar5 + iVar10;
          }
        }
        coordinateForItem((QTreeViewPrivate *)CONCAT44(iVar4,iVar10),item);
        itemHeight(in_RDI,item_00);
        QRect::QRect((QRect *)CONCAT17(uVar9,CONCAT16(in_stack_ffffffffffffff8e,
                                                      in_stack_ffffffffffffff88)),
                     in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                     in_stack_ffffffffffffff78);
      }
    }
    else {
      QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    }
  }
  else {
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  QVar2.x2.m_i = (int)local_10;
  QVar2._0_8_ = local_18;
  QVar2.y2.m_i = (int)((ulong)local_10 >> 0x20);
  return QVar2;
}

Assistant:

QRect QTreeViewPrivate::visualRect(const QModelIndex &index, RectRule rule) const
{
    Q_Q(const QTreeView);

    if (!isIndexValid(index))
        return QRect();

    // Calculate the entire row's rectangle, even if one of the elements is hidden
    if (q->isIndexHidden(index) && rule != FullRow)
        return QRect();

    executePostedLayout();

    const int viewIndex = this->viewIndex(index);
    if (viewIndex < 0)
        return QRect();

    const bool spanning = viewItems.at(viewIndex).spanning;
    const int column = index.column();

    // if we have a spanning item, make the selection stretch from left to right
    int x = (spanning ? 0 : q->columnViewportPosition(column));
    int width = (spanning ? header->length() : q->columnWidth(column));

    const bool addIndentation = isTreePosition(column) && (column > 0 || rule == SingleSection);

    if (rule == FullRow) {
        x = 0;
        width = q->viewport()->width();
    } else if (addIndentation) {
        // calculate indentation
        const int indentation = indentationForItem(viewIndex);
        width -= indentation;
        if (!q->isRightToLeft())
            x += indentation;
    }

    const int y = coordinateForItem(viewIndex);
    const int height = itemHeight(viewIndex);

    return QRect(x, y, width, height);
}